

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O1

string * __thiscall
flatbuffers::(anonymous_namespace)::LuaBfbsGenerator::GenerateMethod_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Field *field)

{
  ushort uVar1;
  Field *pFVar2;
  BaseType base_type;
  char *pcVar3;
  void *this_00;
  char *pcVar4;
  string local_40;
  
  if (*(ushort *)(field + -(long)*(int *)field) < 7) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(field + (6 - (long)*(int *)field));
  }
  if (uVar1 == 0) {
    pFVar2 = (Field *)0x0;
  }
  else {
    pFVar2 = field + (ulong)*(uint *)(field + uVar1) + (ulong)uVar1;
  }
  this_00 = (void *)0x0;
  base_type = None;
  if (4 < *(ushort *)(pFVar2 + -(long)*(int *)pFVar2)) {
    base_type = (BaseType)*(ushort *)(pFVar2 + (4 - (long)*(int *)pFVar2));
  }
  if ((short)base_type != 0) {
    this_00 = (void *)(ulong)(uint)(int)(char)pFVar2[base_type].super_Table;
  }
  if ((int)this_00 - 1U < 0xc) {
    GenerateType_abi_cxx11_(&local_40,this_00,base_type);
    (**(code **)(*(long *)((long)this + 0xe8) + 0xa0))
              (__return_storage_ptr__,(long)this + 0xe8,&local_40,*(undefined4 *)((long)this + 0xf0)
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((int)this_00 == 0xf) {
      pcVar4 = "Struct";
      pcVar3 = "";
    }
    else {
      pcVar4 = "UOffsetTRelative";
      pcVar3 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateMethod(const r::Field *field) const {
    const r::BaseType base_type = field->type()->base_type();
    if (IsScalar(base_type)) { return namer_.Type(GenerateType(base_type)); }
    if (IsStructOrTable(base_type)) { return "Struct"; }
    return "UOffsetTRelative";
  }